

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O0

void A_KSpiritSeeker(AActor *actor,DAngle *thresh,DAngle *turnMax)

{
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  double dVar4;
  double dVar5;
  TAngle<double> local_68;
  TAngle<double> local_60;
  TAngle<double> local_58;
  TAngle<double> local_50;
  double local_48;
  double deltaZ;
  double newZ;
  AActor *target;
  DAngle delta;
  int dir;
  DAngle *turnMax_local;
  DAngle *thresh_local;
  AActor *actor_local;
  
  TAngle<double>::TAngle((TAngle<double> *)&target);
  newZ = (double)TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->tracer);
  if ((AActor *)newZ != (AActor *)0x0) {
    delta.Degrees._4_4_ = P_FaceMobj(actor,(AActor *)newZ,(DAngle *)&target);
    TAngle<double>::TAngle(&local_50,thresh);
    bVar1 = TAngle<double>::operator>((TAngle<double> *)&target,&local_50);
    if (bVar1) {
      TAngle<double>::operator/=((TAngle<double> *)&target,2.0);
      TAngle<double>::TAngle(&local_58,turnMax);
      bVar1 = TAngle<double>::operator>((TAngle<double> *)&target,&local_58);
      if (bVar1) {
        TAngle<double>::operator=((TAngle<double> *)&target,turnMax);
      }
    }
    if (delta.Degrees._4_4_ == 0) {
      TAngle<double>::TAngle(&local_68,(TAngle<double> *)&target);
      TAngle<double>::operator-=(&(actor->Angles).Yaw,&local_68);
    }
    else {
      TAngle<double>::TAngle(&local_60,(TAngle<double> *)&target);
      TAngle<double>::operator+=(&(actor->Angles).Yaw,&local_60);
    }
    AActor::VelFromAngle(actor);
    if ((level.time & 0xfU) != 0) {
      dVar4 = AActor::Z(actor);
      dVar5 = AActor::Z((AActor *)newZ);
      pAVar3 = AActor::GetDefault((AActor *)newZ);
      if (dVar4 <= dVar5 + pAVar3->Height) {
        dVar4 = AActor::Top(actor);
        dVar5 = AActor::Z((AActor *)newZ);
        if (dVar5 <= dVar4) {
          return;
        }
      }
    }
    dVar4 = AActor::Z((AActor *)newZ);
    iVar2 = FRandom::operator()(&pr_kspiritseek);
    pAVar3 = AActor::GetDefault((AActor *)newZ);
    dVar4 = dVar4 + ((double)iVar2 * pAVar3->Height) / 256.0;
    deltaZ = dVar4;
    local_48 = AActor::Z(actor);
    local_48 = dVar4 - local_48;
    if (15.0 < ABS(local_48)) {
      if (local_48 <= 0.0) {
        local_48 = -15.0;
      }
      else {
        local_48 = 15.0;
      }
    }
    dVar4 = local_48;
    dVar5 = AActor::DistanceBySpeed(actor,(AActor *)newZ,actor->Speed);
    (actor->Vel).Z = dVar4 + dVar5;
  }
  return;
}

Assistant:

static void A_KSpiritSeeker (AActor *actor, DAngle thresh, DAngle turnMax)
{
	int dir;
	DAngle delta;
	AActor *target;
	double newZ;
	double deltaZ;

	target = actor->tracer;
	if (target == NULL)
	{
		return;
	}
	dir = P_FaceMobj (actor, target, &delta);
	if (delta > thresh)
	{
		delta /= 2;
		if(delta > turnMax)
		{
			delta = turnMax;
		}
	}
	if(dir)
	{ // Turn clockwise
		actor->Angles.Yaw += delta;
	}
	else
	{ // Turn counter clockwise
		actor->Angles.Yaw -= delta;
	}
	actor->VelFromAngle();

	if (!(level.time&15) 
		|| actor->Z() > target->Z() + target->GetDefault()->Height
		|| actor->Top() < target->Z())
	{
		newZ = target->Z() + pr_kspiritseek() * target->GetDefault()->Height / 256;
		deltaZ = newZ-actor->Z();

		if (fabs(deltaZ) > 15)
		{
			if(deltaZ > 0)
			{
				deltaZ = 15;
			}
			else
			{
				deltaZ = -15;
			}
		}
		actor->Vel.Z = deltaZ + actor->DistanceBySpeed(target, actor->Speed);
	}
	return;
}